

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionDirWrapper.cpp
# Opt level: O2

addr_type __thiscall
ExceptionEntryWrapper::containsAddrType(ExceptionEntryWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)
            ._vptr_AbstractByteBuffer[0xc])();
  if (iVar1 == 1) {
    if (fieldId < 3) {
      return RVA;
    }
  }
  else {
    iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
              super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xc])();
    if ((iVar1 == 2) &&
       (iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
                  super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])(), iVar1 == 0x40)) {
      if (fieldId == 0) {
        return RVA;
      }
      if (fieldId == 1) {
        iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0xc])(this);
        if (CONCAT44(extraout_var,iVar1) != 0) {
          return (uint)((*(byte *)(CONCAT44(extraout_var,iVar1) + 4) & 3) == 0) * 2;
        }
      }
    }
  }
  return NOT_ADDR;
}

Assistant:

Executable::addr_type ExceptionEntryWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    if (this->m_Exe->getArch() == Executable::ARCH_INTEL) {
        switch (fieldId) {
            case BEGIN_ADDR :
            case END_ADDR :
            case UNWIND_INFO_ADDR :
                return Executable::RVA;
        }
    }
    else if (this->m_Exe->getArch() == Executable::ARCH_ARM && this->m_Exe->getBitMode() == 64) {

        if (fieldId == ARM_EXCEPT_START) return Executable::RVA;
        if (fieldId == ARM_EXCEPT_XDATA) {
            ARM_EXCEPT_RECORD *rec = (ARM_EXCEPT_RECORD*) this->getPtr();
            if (!rec) return Executable::NOT_ADDR;
            
            if (rec->Xdata & ARM_XDATA_FLAG) {
                return Executable::NOT_ADDR;
            }
            return Executable::RVA;
        }
    }
    return Executable::NOT_ADDR;
}